

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     AssignmentOperatorHelper<false,_unsigned_char,_unsigned_char,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute(View<unsigned_char,_false,_std::allocator<unsigned_long>_> *from,
              View<unsigned_char,_false,_std::allocator<unsigned_long>_> *to)

{
  uchar uVar1;
  CoordinateOrder CVar2;
  view_pointer pVVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  runtime_error *this;
  reference puVar7;
  reference puVar8;
  size_t sVar9;
  unsigned_long *puVar10;
  reference puVar11;
  reference puVar12;
  reference puVar13;
  reference puVar14;
  void *dataPointer_;
  void *vDataPointer_;
  ulong uVar15;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> m;
  ToIterator itTo;
  undefined1 local_a8 [16];
  unsigned_long *local_98;
  unsigned_long *local_90;
  unsigned_long *local_88;
  pointer local_80;
  ulong uStack_78;
  CoordinateOrder local_70;
  bool local_6c;
  Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_> local_60;
  
  if (from != to) {
    if (to->data_ != (pointer)0x0) {
      if ((from->data_ == (pointer)0x0) ||
         ((from->geometry_).dimension_ != (to->geometry_).dimension_)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Assertion failed.");
      }
      else {
        uVar15 = 0;
        do {
          if ((from->geometry_).dimension_ <= uVar15) {
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(from);
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
            puVar11 = from->data_;
            if ((puVar11 != (reference)0x0) && (puVar12 = to->data_, puVar12 != (reference)0x0)) {
              puVar7 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                                 (from,(from->geometry_).size_ - 1);
              puVar8 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                                 (to,(to->geometry_).size_ - 1);
              if (((puVar11 <= puVar12) && (puVar12 <= puVar7)) ||
                 ((puVar12 <= puVar11 && (puVar11 <= puVar8)))) {
                Marray<unsigned_char,std::allocator<unsigned_long>>::
                Marray<unsigned_char,false,std::allocator<unsigned_long>>
                          ((Marray<unsigned_char,std::allocator<unsigned_long>> *)local_a8,from);
                execute((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_a8,to);
                operator_delete((void *)local_a8._0_8_,uStack_78);
                goto LAB_00104e20;
              }
            }
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(from);
            CVar2 = (from->geometry_).coordinateOrder_;
            View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
            if (((CVar2 == (to->geometry_).coordinateOrder_) &&
                (View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(from),
                (from->geometry_).isSimple_ == true)) &&
               (View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(to),
               (to->geometry_).isSimple_ == true)) {
              memcpy(to->data_,from->data_,(from->geometry_).size_);
              return;
            }
            pVVar3 = (view_pointer)from->data_;
            if (pVVar3 == (view_pointer)0x0) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this,"Assertion failed.");
              goto LAB_00104efc;
            }
            switch((from->geometry_).dimension_) {
            case 1:
              local_a8._0_8_ = pVVar3;
              local_98 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                                   ((new_allocator<unsigned_long> *)(local_a8 + 8),3,(void *)0x0);
              local_80 = (pointer)(from->geometry_).dimension_;
              uStack_78 = (from->geometry_).size_;
              sVar5 = (from->geometry_).dimension_;
              local_90 = local_98 + sVar5;
              local_88 = local_90 + sVar5;
              local_70 = (from->geometry_).coordinateOrder_;
              local_6c = (from->geometry_).isSimple_;
              memcpy(local_98,(from->geometry_).shape_,sVar5 * 0x18);
              View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8);
              local_60.view_._0_4_ = 0;
              puVar11 = AccessOperatorHelper<true>::
                        execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                  (to,(int *)&local_60);
              local_60.view_._0_4_ = 0;
              puVar12 = AccessOperatorHelper<true>::
                        execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                  (from,(int *)&local_60);
              sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(to,0);
              if (sVar5 != 0) {
                uVar15 = 0;
                do {
                  *puVar11 = *puVar12;
                  sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::strides(to,0);
                  sVar6 = View<unsigned_char,_true,_std::allocator<unsigned_long>_>::strides
                                    ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)
                                     local_a8,0);
                  sVar9 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(to,0);
                  puVar11 = puVar11 + sVar5;
                  uVar15 = uVar15 + 1;
                  puVar12 = puVar12 + sVar6;
                } while (uVar15 < sVar9);
              }
              View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(to,0);
              View<unsigned_char,_false,_std::allocator<unsigned_long>_>::strides(to,0);
              View<unsigned_char,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
              View<unsigned_char,_true,_std::allocator<unsigned_long>_>::strides
                        ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8,0);
LAB_00104e20:
              uVar15 = (long)local_80 * 0x18;
              puVar10 = local_98;
              break;
            case 2:
              local_a8._0_8_ = pVVar3;
              local_98 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                                   ((new_allocator<unsigned_long> *)(local_a8 + 8),6,(void *)0x0);
              local_80 = (pointer)(from->geometry_).dimension_;
              uStack_78 = (from->geometry_).size_;
              sVar5 = (from->geometry_).dimension_;
              local_90 = local_98 + sVar5;
              local_88 = local_90 + sVar5;
              local_70 = (from->geometry_).coordinateOrder_;
              local_6c = (from->geometry_).isSimple_;
              memcpy(local_98,(from->geometry_).shape_,sVar5 * 0x18);
              View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8);
              local_60.view_._0_4_ = 0;
              puVar11 = AccessOperatorHelper<true>::
                        execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                  (to,(int *)&local_60);
              local_60.view_._0_4_ = 0;
              puVar12 = AccessOperatorHelper<true>::
                        execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                  (from,(int *)&local_60);
              OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(to,local_a8,puVar11,puVar12);
              goto LAB_00104e20;
            case 3:
              local_a8._0_8_ = pVVar3;
              local_98 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                                   ((new_allocator<unsigned_long> *)(local_a8 + 8),9,(void *)0x0);
              local_80 = (pointer)(from->geometry_).dimension_;
              uStack_78 = (from->geometry_).size_;
              sVar5 = (from->geometry_).dimension_;
              local_90 = local_98 + sVar5;
              local_88 = local_90 + sVar5;
              local_70 = (from->geometry_).coordinateOrder_;
              local_6c = (from->geometry_).isSimple_;
              memcpy(local_98,(from->geometry_).shape_,sVar5 * 0x18);
              View<unsigned_char,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8);
              local_60.view_._0_4_ = 0;
              puVar11 = AccessOperatorHelper<true>::
                        execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                  (to,(int *)&local_60);
              local_60.view_._0_4_ = 0;
              puVar12 = AccessOperatorHelper<true>::
                        execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                  (from,(int *)&local_60);
              OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(to,local_a8,puVar11,puVar12);
              goto LAB_00104e20;
            case 4:
              View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                        ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8,from)
              ;
              local_60.view_._0_4_ = 0;
              puVar11 = AccessOperatorHelper<true>::
                        execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                  (to,(int *)&local_60);
              local_60.view_._0_4_ = 0;
              puVar12 = AccessOperatorHelper<true>::
                        execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                  (from,(int *)&local_60);
              OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
              ::operate(to,local_a8,puVar11,puVar12);
              goto LAB_00104e20;
            default:
              sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 5) {
                View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                          ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8,
                           from);
                local_60.view_._0_4_ = 0;
                puVar11 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                puVar12 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,puVar11,puVar12);
                goto LAB_00104e20;
              }
              sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 6) {
                View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                          ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8,
                           from);
                local_60.view_._0_4_ = 0;
                puVar11 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                puVar12 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,puVar11,puVar12);
                goto LAB_00104e20;
              }
              sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 7) {
                View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                          ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8,
                           from);
                local_60.view_._0_4_ = 0;
                puVar11 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                puVar12 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,puVar11,puVar12);
                goto LAB_00104e20;
              }
              sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 8) {
                View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                          ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8,
                           from);
                local_60.view_._0_4_ = 0;
                puVar11 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                puVar12 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,puVar11,puVar12);
                goto LAB_00104e20;
              }
              sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 9) {
                View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                          ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8,
                           from);
                local_60.view_._0_4_ = 0;
                puVar11 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                puVar12 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,puVar11,puVar12);
                goto LAB_00104e20;
              }
              sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension(from);
              if (sVar5 == 10) {
                View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
                          ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8,
                           from);
                local_60.view_._0_4_ = 0;
                puVar11 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (to,(int *)&local_60);
                local_60.view_._0_4_ = 0;
                puVar12 = AccessOperatorHelper<true>::
                          execute<unsigned_char,int,false,std::allocator<unsigned_long>>
                                    (from,(int *)&local_60);
                OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<unsigned_char,_unsigned_char>,_unsigned_char,_unsigned_char,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,local_a8,puVar11,puVar12);
                goto LAB_00104e20;
              }
              View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(from);
              Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8,
                         from,0);
              View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
              Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_60,to,0);
              while (bVar4 = Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::hasMore
                                       ((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                         *)local_a8), bVar4) {
                puVar13 = Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::operator*
                                    ((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>
                                      *)local_a8);
                uVar1 = *puVar13;
                puVar14 = Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator*
                                    (&local_60);
                *puVar14 = uVar1;
                Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_>::operator++
                          ((Iterator<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_a8
                          );
                Iterator<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator++
                          (&local_60);
              }
              if (local_60.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_90 == (unsigned_long *)0x0) {
                return;
              }
              uVar15 = (long)local_80 - (long)local_90;
              puVar10 = local_90;
            }
            operator_delete(puVar10,uVar15);
            return;
          }
          sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(from,uVar15);
          sVar6 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape(to,uVar15);
          if (sVar5 != sVar6) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Assertion failed.");
            goto LAB_00104efc;
          }
          uVar15 = uVar15 + 1;
        } while (from->data_ != (pointer)0x0);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Assertion failed.");
      }
LAB_00104efc:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    to->data_ = from->data_;
    sVar5 = (from->geometry_).dimension_;
    puVar10 = (to->geometry_).shape_;
    sVar6 = (to->geometry_).dimension_;
    if (sVar5 != sVar6) {
      operator_delete(puVar10,sVar6 * 0x18);
      sVar5 = (from->geometry_).dimension_;
      (to->geometry_).dimension_ = sVar5;
      puVar10 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                          ((new_allocator<unsigned_long> *)&to->geometry_,sVar5 * 3,(void *)0x0);
      (to->geometry_).shape_ = puVar10;
      sVar5 = (to->geometry_).dimension_;
      (to->geometry_).shapeStrides_ = puVar10 + sVar5;
      (to->geometry_).strides_ = puVar10 + sVar5 + sVar5;
      sVar5 = (from->geometry_).dimension_;
      (to->geometry_).dimension_ = sVar5;
    }
    memcpy(puVar10,(from->geometry_).shape_,sVar5 * 0x18);
    (to->geometry_).size_ = (from->geometry_).size_;
    (to->geometry_).coordinateOrder_ = (from->geometry_).coordinateOrder_;
    (to->geometry_).isSimple_ = (from->geometry_).isSimple_;
  }
  return;
}

Assistant:

static void execute
    (
        const View<TFrom, false, AFrom>& from,
        View<TTo, false, ATo>& to
    )
    {
        typedef typename View<TFrom, false, AFrom>::const_iterator FromIterator;
        typedef typename View<TTo, false, ATo>::iterator ToIterator;
        if(static_cast<const void*>(&from) != static_cast<const void*>(&to)) { // no self-assignment
            if(to.data_ == 0) { // if the view 'to' is not initialized
                // initialize the view 'to' with source data
                Assert(MARRAY_NO_ARG_TEST || sizeof(TTo) == sizeof(TFrom));
                to.data_ = static_cast<TTo*>(static_cast<void*>(from.data_)); // copy pointer
                to.geometry_ = from.geometry_;
            }
            else { // if the view 'to' is initialized
                if(!MARRAY_NO_ARG_TEST) {
                    Assert(from.data_ != 0 && from.dimension() == to.dimension());
                    for(std::size_t j=0; j<from.dimension(); ++j) {
                        Assert(from.shape(j) == to.shape(j));
                    }
                }
                if(from.overlaps(to)) {
                    Marray<TFrom, AFrom> m = from; // temporary copy
                    execute(m, to);
                }
                else if(from.coordinateOrder() == to.coordinateOrder() 
                        && from.isSimple() && to.isSimple()
                        && IsEqual<TFrom, TTo>::type) {
                    memcpy(to.data_, from.data_, (from.size())*sizeof(TFrom));
                }
                else if(from.dimension() == 1)
                    OperateHelperBinary<1, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 2)
                    OperateHelperBinary<2, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 3)
                    OperateHelperBinary<3, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 4)
                    OperateHelperBinary<4, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 5)
                    OperateHelperBinary<5, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 6)
                    OperateHelperBinary<6, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 7)
                    OperateHelperBinary<7, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 8)
                    OperateHelperBinary<8, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 9)
                    OperateHelperBinary<9, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else if(from.dimension() == 10)
                    OperateHelperBinary<10, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
                else {
                    FromIterator itFrom = from.begin();
                    ToIterator itTo = to.begin();
                    for(; itFrom.hasMore(); ++itFrom, ++itTo) {
                        *itTo = static_cast<TTo>(*itFrom);
                    }
                }
            }
        }
    }